

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O0

int Granulator::ReleaseCallback(UnityAudioEffectState *state)

{
  float *pfVar1;
  EffectData *pEVar2;
  EffectData *data;
  UnityAudioEffectState *state_local;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<Granulator::EffectData>(state);
  pfVar1 = (pEVar2->delay).data;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  pfVar1 = (pEVar2->delay).preview;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  if (pEVar2 != (EffectData *)0x0) {
    operator_delete(pEVar2,0x52f8);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ReleaseCallback(UnityAudioEffectState* state)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        delete[] data->delay.data;
        delete[] data->delay.preview;
        delete data;
        return UNITY_AUDIODSP_OK;
    }